

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O3

bool __thiscall xray_re::xr_ogf_v4::progressive(xr_ogf_v4 *this)

{
  ogf_model_type oVar1;
  
  oVar1 = (this->super_xr_ogf).m_model_type;
  return (bool)((byte)(0x814 >> ((byte)oVar1 & 0x1f)) & oVar1 < MT3_TREE);
}

Assistant:

bool xr_ogf_v4::progressive() const
{
	switch (m_model_type) {
	case MT4_PROGRESSIVE:
	case MT4_SKELETON_GEOMDEF_PM:
	case MT4_TREE_PM:
		return true;
	default:
		return false;
	}
}